

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

void duckdb::ListLengthFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong count;
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  bool bVar4;
  idx_t i_1;
  reference vector;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t i;
  idx_t row_idx;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    pdVar9 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pdVar9 = pdVar9 + 8;
      for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
        *(undefined8 *)(pdVar1 + uVar6 * 8) = *(undefined8 *)pdVar9;
        pdVar9 = pdVar9 + 0x10;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
      puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar6 = 0;
      for (uVar7 = 0; uVar7 != count + 0x3f >> 6; uVar7 = uVar7 + 1) {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar12 = uVar6 + 0x40;
          if (count <= uVar6 + 0x40) {
            uVar12 = count;
          }
LAB_0082f60c:
          pdVar10 = pdVar9 + uVar6 * 0x10 + 8;
          for (; uVar8 = uVar6, uVar6 < uVar12; uVar6 = uVar6 + 1) {
            *(undefined8 *)(pdVar1 + uVar6 * 8) = *(undefined8 *)pdVar10;
            pdVar10 = pdVar10 + 0x10;
          }
        }
        else {
          uVar3 = puVar2[uVar7];
          uVar12 = uVar6 + 0x40;
          if (count <= uVar6 + 0x40) {
            uVar12 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_0082f60c;
          uVar8 = uVar12;
          if (uVar3 != 0) {
            pdVar10 = pdVar9 + uVar6 * 0x10 + 8;
            for (uVar11 = 0; uVar8 = uVar6 + uVar11, uVar6 + uVar11 < uVar12; uVar11 = uVar11 + 1) {
              if ((uVar3 >> (uVar11 & 0x3f) & 1) != 0) {
                *(undefined8 *)(pdVar1 + uVar11 * 8 + uVar6 * 8) = *(undefined8 *)pdVar10;
              }
              pdVar10 = pdVar10 + 0x10;
            }
          }
        }
        uVar6 = uVar8;
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar1 = result->data;
    pdVar9 = vector->data;
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      *(undefined8 *)pdVar1 = *(undefined8 *)(pdVar9 + 8);
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
        uVar7 = uVar6;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_78.sel)->sel_vector[uVar6];
        }
        *(undefined8 *)(pdVar1 + uVar6 * 8) = *(undefined8 *)(local_78.data + uVar7 * 0x10 + 8);
      }
    }
    else {
      for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
        iVar5 = row_idx;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(local_78.sel)->sel_vector[row_idx];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
             >> (iVar5 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
        }
        else {
          *(undefined8 *)(pdVar1 + row_idx * 8) = *(undefined8 *)(local_78.data + iVar5 * 0x10 + 8);
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  bVar4 = DataChunk::AllConstant(args);
  if (bVar4) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListLengthFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input = args.data[0];
	D_ASSERT(input.GetType().id() == LogicalTypeId::LIST);
	UnaryExecutor::Execute<list_entry_t, int64_t>(
	    input, result, args.size(), [](list_entry_t input) { return UnsafeNumericCast<int64_t>(input.length); });
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}